

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall
ClipperLib::Clipper::AddIntersectNode(Clipper *this,TEdge *e1,TEdge *e2,IntPoint *pt)

{
  bool bVar1;
  IntersectNode *this_00;
  bool local_59;
  IntersectNode *local_48;
  IntersectNode *iNode;
  IntersectNode *newNode;
  IntPoint *pt_local;
  TEdge *e2_local;
  TEdge *e1_local;
  Clipper *this_local;
  
  this_00 = (IntersectNode *)operator_new(0x28);
  IntersectNode::IntersectNode(this_00);
  this_00->edge1 = e1;
  this_00->edge2 = e2;
  (this_00->pt).X = pt->X;
  (this_00->pt).Y = pt->Y;
  this_00->next = (IntersectNode *)0x0;
  if (this->m_IntersectNodes == (IntersectNode *)0x0) {
    this->m_IntersectNodes = this_00;
  }
  else {
    bVar1 = ProcessParam1BeforeParam2(this_00,this->m_IntersectNodes);
    if (bVar1) {
      this_00->next = this->m_IntersectNodes;
      this->m_IntersectNodes = this_00;
    }
    else {
      local_48 = this->m_IntersectNodes;
      while( true ) {
        local_59 = false;
        if (local_48->next != (IntersectNode *)0x0) {
          local_59 = ProcessParam1BeforeParam2(local_48->next,this_00);
        }
        if (local_59 == false) break;
        local_48 = local_48->next;
      }
      this_00->next = local_48->next;
      local_48->next = this_00;
    }
  }
  return;
}

Assistant:

void Clipper::AddIntersectNode(TEdge *e1, TEdge *e2, const IntPoint &pt)
{
  IntersectNode* newNode = new IntersectNode;
  newNode->edge1 = e1;
  newNode->edge2 = e2;
  newNode->pt = pt;
  newNode->next = 0;
  if( !m_IntersectNodes ) m_IntersectNodes = newNode;
  else if(  ProcessParam1BeforeParam2(*newNode, *m_IntersectNodes) )
  {
    newNode->next = m_IntersectNodes;
    m_IntersectNodes = newNode;
  }
  else
  {
    IntersectNode* iNode = m_IntersectNodes;
    while( iNode->next  && ProcessParam1BeforeParam2(*iNode->next, *newNode) )
        iNode = iNode->next;
    newNode->next = iNode->next;
    iNode->next = newNode;
  }
}